

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O2

void de::cmdline::detail::dispatchSetDefault<de::cmdline::(anonymous_namespace)::Help>
               (TypedFieldMap *dst)

{
  ValueType *value;
  
  value = (ValueType *)operator_new(1);
  *value = false;
  TypedFieldMap::set<de::cmdline::(anonymous_namespace)::Help>(dst,value);
  return;
}

Assistant:

void dispatchSetDefault (TypedFieldMap* dst)
{
	typename OptTraits<OptType>::ValueType* value = new typename OptTraits<OptType>::ValueType();
	try
	{
		getTypeDefault<typename OptTraits<OptType>::ValueType>(value);
		dst->set<OptType>(value);
	}
	catch (...)
	{
		delete value;
		throw;
	}
}